

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O0

void __thiscall ImPlotPlot::ImPlotPlot(ImPlotPlot *this)

{
  ImPlotAxis *local_30;
  ImVec2 local_28;
  int local_20;
  int i;
  ImPlotPlot *local_10;
  ImPlotPlot *this_local;
  
  local_10 = this;
  ImPlotAxis::ImPlotAxis(&this->XAxis);
  local_30 = this->YAxis;
  do {
    ImPlotAxis::ImPlotAxis(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (ImPlotAxis *)&this->LegendData);
  ImPlotLegendData::ImPlotLegendData(&this->LegendData);
  ImPool<ImPlotItem>::ImPool(&this->Items);
  ImVec2::ImVec2(&this->SelectStart);
  ImRect::ImRect(&this->SelectRect);
  ImVec2::ImVec2(&this->QueryStart);
  ImRect::ImRect(&this->QueryRect);
  ImRect::ImRect(&this->FrameRect);
  ImRect::ImRect(&this->CanvasRect);
  ImRect::ImRect(&this->PlotRect);
  ImRect::ImRect(&this->AxesRect);
  ImRect::ImRect(&this->LegendRect);
  this->PreviousFlags = 0;
  this->Flags = 0;
  (this->XAxis).Orientation = 0;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    this->YAxis[local_20].Orientation = 1;
  }
  ImVec2::ImVec2(&local_28,0.0,0.0);
  this->QueryStart = local_28;
  this->SelectStart = this->QueryStart;
  this->LegendFlipSideNextFrame = false;
  this->LegendOutside = false;
  this->LegendHovered = false;
  this->DraggingQuery = false;
  this->Queried = false;
  this->Querying = false;
  this->ContextLocked = false;
  this->Selected = false;
  this->Selecting = false;
  this->Initialized = false;
  this->CurrentYAxis = 0;
  this->ColormapIdx = 0;
  this->LegendLocation = 5;
  this->LegendOrientation = 1;
  this->MousePosLocation = 10;
  return;
}

Assistant:

ImPlotPlot() {
        Flags             = PreviousFlags = ImPlotFlags_None;
        XAxis.Orientation = ImPlotOrientation_Horizontal;
        for (int i = 0; i < IMPLOT_Y_AXES; ++i)
            YAxis[i].Orientation = ImPlotOrientation_Vertical;
        SelectStart       = QueryStart = ImVec2(0,0);
        Initialized       = Selecting = Selected = ContextLocked = Querying = Queried = DraggingQuery = LegendHovered = LegendOutside = LegendFlipSideNextFrame = false;
        ColormapIdx       = CurrentYAxis = 0;
        LegendLocation    = ImPlotLocation_North | ImPlotLocation_West;
        LegendOrientation = ImPlotOrientation_Vertical;
        MousePosLocation  = ImPlotLocation_South | ImPlotLocation_East;
    }